

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compoundfile_stream_and_dir.hpp
# Opt level: O0

void __thiscall CompoundFile::Directory::load(Directory *this,Stream *stream)

{
  char cVar1;
  iterator retVal;
  iterator iVar2;
  ulong uVar3;
  undefined8 uVar4;
  long *in_RSI;
  Exception *in_RDI;
  int32_t sec;
  uint16_t symbol;
  vector<unsigned_short,_std::allocator<unsigned_short>_> data;
  int16_t i;
  int16_t maxSymbolsInName;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_stack_ffffffffffffff58;
  value_type_conflict2 *in_stack_ffffffffffffff68;
  wstring *what;
  SecID local_7c;
  undefined4 in_stack_ffffffffffffff88;
  int32_t id;
  undefined2 in_stack_ffffffffffffff8c;
  undefined1 in_stack_ffffffffffffff8e;
  allocator in_stack_ffffffffffffff8f;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
  *in_stack_ffffffffffffff90;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  in_stack_ffffffffffffff98;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffb0;
  int32_t bytes;
  unsigned_short *in_stack_ffffffffffffffb8;
  ushort in_stack_ffffffffffffffc0;
  short in_stack_ffffffffffffffc2;
  undefined4 in_stack_ffffffffffffffc4;
  wstring local_30;
  long *local_10;
  
  local_30.field_2._M_local_buf[3]._2_2_ = 0x20;
  local_30.field_2._M_local_buf[3]._0_2_ = 1;
  local_10 = in_RSI;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x12a0f7);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::reserve
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)in_stack_ffffffffffffff90,
             CONCAT17(in_stack_ffffffffffffff8f,
                      CONCAT16(in_stack_ffffffffffffff8e,
                               CONCAT24(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88))));
  for (; (short)local_30.field_2._M_local_buf[3]._0_2_ < 0x21;
      local_30.field_2._M_local_buf[3]._0_2_ = local_30.field_2._M_local_buf[3]._0_2_ + 1) {
    in_stack_ffffffffffffffc2 = 0;
    Excel::Stream::read<unsigned_short>
              ((Stream *)CONCAT44(in_stack_ffffffffffffffc4,(uint)in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8,(int32_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
    if (in_stack_ffffffffffffffc2 == 0) break;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)in_RDI,
               in_stack_ffffffffffffff68);
  }
  what = &local_30;
  retVal = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                     (in_stack_ffffffffffffff58);
  iVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end
                    (in_stack_ffffffffffffff58);
  bytes = (int32_t)((ulong)iVar2._M_current >> 0x20);
  std::__cxx11::wstring::
  assign<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,void>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if ((short)local_30.field_2._M_local_buf[3]._0_2_ < 0x20) {
    (**(code **)(*local_10 + 0x20))
              (local_10,(0x20 - (short)local_30.field_2._M_local_buf[3]._0_2_) * 2,1);
  }
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)in_RDI);
  (**(code **)(*local_10 + 0x20))(local_10,2,1);
  cVar1 = (**(code **)(*local_10 + 0x10))();
  *(int *)&(in_RDI->m_what).field_2 = (int)cVar1;
  uVar3 = (**(code **)(*local_10 + 0x18))();
  if ((uVar3 & 1) != 0) {
    uVar4 = __cxa_allocate_exception(0x30);
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring
              ((wstring *)&stack0xffffffffffffff90,L"Unexpected end of file.",
               (allocator *)&stack0xffffffffffffff8f);
    Exception::Exception(in_RDI,what);
    __cxa_throw(uVar4,&Exception::typeinfo,Exception::~Exception);
  }
  (**(code **)(*local_10 + 0x20))(local_10,1);
  Excel::Stream::read<int>
            ((Stream *)
             CONCAT44(in_stack_ffffffffffffffc4,
                      CONCAT22(in_stack_ffffffffffffffc2,in_stack_ffffffffffffffc0)),
             (int *)retVal._M_current,bytes);
  Excel::Stream::read<int>
            ((Stream *)
             CONCAT44(in_stack_ffffffffffffffc4,
                      CONCAT22(in_stack_ffffffffffffffc2,in_stack_ffffffffffffffc0)),
             (int *)retVal._M_current,bytes);
  Excel::Stream::read<int>
            ((Stream *)
             CONCAT44(in_stack_ffffffffffffffc4,
                      CONCAT22(in_stack_ffffffffffffffc2,in_stack_ffffffffffffffc0)),
             (int *)retVal._M_current,bytes);
  (**(code **)(*local_10 + 0x20))(local_10,0x24,1);
  id = 0;
  Excel::Stream::read<int>
            ((Stream *)
             CONCAT44(in_stack_ffffffffffffffc4,
                      CONCAT22(in_stack_ffffffffffffffc2,in_stack_ffffffffffffffc0)),
             (int *)retVal._M_current,bytes);
  SecID::SecID(&local_7c,id);
  (in_RDI->m_what).field_2._M_local_buf[1] = local_7c.m_id;
  Excel::Stream::read<int>
            ((Stream *)
             CONCAT44(in_stack_ffffffffffffffc4,
                      CONCAT22(in_stack_ffffffffffffffc2,in_stack_ffffffffffffffc0)),
             (int *)retVal._M_current,bytes);
  (**(code **)(*local_10 + 0x20))(local_10,4,1);
  return;
}

Assistant:

inline void
Directory::load( Stream & stream )
{
	{
		const int16_t maxSymbolsInName = 32;

		int16_t i = 1;

		std::vector< uint16_t > data;
		data.reserve( maxSymbolsInName - 1 );

		for( ; i <= maxSymbolsInName; ++i )
		{
			uint16_t symbol = 0;
			stream.read( symbol, 2 );

			if( symbol != 0 )
				data.push_back( symbol );
			else
				break;
		}

		m_name.assign( data.begin(), data.end() );

		if( i < maxSymbolsInName )
			stream.seek( ( maxSymbolsInName - i ) * 2, Stream::FromCurrent );
	}

	stream.seek( 2, Stream::FromCurrent );
	m_type = (Type)(int32_t) stream.getByte();

	if( stream.eof() )
		throw Exception( L"Unexpected end of file." );

	stream.seek( 1, Stream::FromCurrent );
	stream.read( m_leftChild, 4 );
	stream.read( m_rightChild, 4 );
	stream.read( m_rootNode, 4 );
	stream.seek( 36, Stream::FromCurrent );

	{
		int32_t sec = 0;
		stream.read( sec, 4 );
		m_secID = sec;
	}

	stream.read( m_streamSize, 4 );
	stream.seek( 4, Stream::FromCurrent );
}